

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

String * __thiscall
glcts::LayoutBindingBaseCase::buildLayout_abi_cxx11_
          (String *__return_storage_ptr__,LayoutBindingBaseCase *this,int binding)

{
  string local_1c8 [48];
  ostringstream local_198 [8];
  ostringstream bindingStr;
  int binding_local;
  LayoutBindingBaseCase *this_local;
  
  bindingStr._372_4_ = binding;
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::ostream::operator<<(local_198,bindingStr._372_4_);
  std::__cxx11::ostringstream::str();
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x19])
            (__return_storage_ptr__,this,local_1c8);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

virtual String buildLayout(int binding)
	{
		std::ostringstream bindingStr;
		bindingStr << binding;
		return buildLayout(bindingStr.str());
	}